

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O0

void __thiscall TinyGC::TinyGC(TinyGC *this)

{
  Visitor *this_00;
  TinyGC *this_local;
  
  std::
  unordered_set<GarbageCollectedBase_*,_std::hash<GarbageCollectedBase_*>,_std::equal_to<GarbageCollectedBase_*>,_std::allocator<GarbageCollectedBase_*>_>
  ::unordered_set(&this->objs_addr_);
  std::
  unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
  ::unordered_map(&this->thread_to_stack_);
  std::mutex::mutex(&this->ts_mxt_);
  std::mutex::mutex(&this->alloc_mxt_);
  this_00 = (Visitor *)operator_new(1);
  Visitor::Visitor(this_00);
  this->visitor_ = this_00;
  this->gc_phase_ = kNone;
  this->bytes_allocated_ = 0;
  this->size_of_objects_ = 0;
  this->gc_count_threshold_ = 0x78;
  this->gc_bytes_threshold_ = 0x1000;
  return;
}

Assistant:

TinyGC::TinyGC()
    : visitor_(new Visitor()),
      gc_phase_(GCPhase::kNone),
      bytes_allocated_(0),
      size_of_objects_(0),
      gc_count_threshold_(120),
      gc_bytes_threshold_(0x1000) {}